

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

stbir_uint32 stbir__calculate_memory(stbir__info *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  
  iVar2 = stbir__get_filter_pixel_width(info->horizontal_filter,info->horizontal_scale);
  iVar3 = stbir__get_filter_pixel_width(info->vertical_filter,info->vertical_scale);
  if (1.0 < info->horizontal_scale) {
    iVar5 = info->output_w;
  }
  else {
    iVar5 = info->input_w;
    iVar4 = stbir__get_filter_pixel_width(info->horizontal_filter,info->horizontal_scale);
    iVar5 = (iVar4 - (iVar4 >> 0x1f) & 0xfffffffeU) + iVar5;
  }
  info->horizontal_num_contributors = iVar5;
  if (1.0 < info->vertical_scale) {
    iVar4 = info->output_h;
  }
  else {
    iVar4 = info->input_h;
    iVar5 = stbir__get_filter_pixel_width(info->vertical_filter,info->vertical_scale);
    iVar4 = (iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU) + iVar4;
    iVar5 = info->horizontal_num_contributors;
  }
  info->vertical_num_contributors = iVar4;
  info->ring_buffer_num_entries = iVar3 + 1;
  info->horizontal_contributors_size = iVar5 * 8;
  fVar6 = info->horizontal_scale;
  fVar6 = (*stbir__filter_info_table[info->horizontal_filter].support)
                    ((float)(-(uint)(fVar6 <= 1.0) & (uint)fVar6 |
                            ~-(uint)(fVar6 <= 1.0) & (uint)(1.0 / fVar6)));
  fVar6 = ceilf(fVar6 + fVar6);
  info->horizontal_coefficients_size = (int)fVar6 * iVar5 * 4;
  iVar3 = info->vertical_num_contributors;
  info->vertical_contributors_size = iVar3 * 8;
  fVar6 = info->vertical_scale;
  fVar6 = (*stbir__filter_info_table[info->vertical_filter].support)
                    ((float)(-(uint)(fVar6 <= 1.0) & (uint)fVar6 |
                            ~-(uint)(fVar6 <= 1.0) & (uint)(1.0 / fVar6)));
  fVar6 = ceilf(fVar6 + fVar6);
  iVar3 = (int)fVar6 * iVar3 * 4;
  info->vertical_coefficients_size = iVar3;
  iVar4 = ((iVar2 / 2) * 2 + info->input_w) * info->channels * 4;
  info->decode_buffer_size = iVar4;
  iVar2 = info->channels * info->output_w * 4;
  info->horizontal_buffer_size = iVar2;
  iVar5 = info->ring_buffer_num_entries * iVar2;
  info->ring_buffer_size = iVar5;
  info->encode_buffer_size = iVar2;
  if (info->horizontal_filter == STBIR_FILTER_DEFAULT) {
    __assert_fail("info->horizontal_filter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x8da,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  if (STBIR_FILTER_MITCHELL < info->horizontal_filter) {
    __assert_fail("info->horizontal_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x8db,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  if (info->vertical_filter == STBIR_FILTER_DEFAULT) {
    __assert_fail("info->vertical_filter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x8dc,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  if (STBIR_FILTER_MITCHELL < info->vertical_filter) {
    __assert_fail("info->vertical_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x8dd,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  iVar1 = 0;
  if (info->vertical_scale <= 1.0) {
    iVar1 = iVar2;
    iVar2 = 0;
  }
  (&info->horizontal_buffer_size)[(ulong)(info->vertical_scale <= 1.0) * 2] = 0;
  return iVar1 + iVar2 +
         iVar4 + iVar3 + iVar5 + info->horizontal_contributors_size +
         info->horizontal_coefficients_size + info->vertical_contributors_size;
}

Assistant:

static stbir_uint32 stbir__calculate_memory(stbir__info *info)
{
    int pixel_margin = stbir__get_filter_pixel_margin(info->horizontal_filter, info->horizontal_scale);
    int filter_height = stbir__get_filter_pixel_width(info->vertical_filter, info->vertical_scale);

    info->horizontal_num_contributors = stbir__get_contributors(info->horizontal_scale, info->horizontal_filter, info->input_w, info->output_w);
    info->vertical_num_contributors   = stbir__get_contributors(info->vertical_scale  , info->vertical_filter  , info->input_h, info->output_h);

    // One extra entry because floating point precision problems sometimes cause an extra to be necessary.
    info->ring_buffer_num_entries = filter_height + 1;

    info->horizontal_contributors_size = info->horizontal_num_contributors * sizeof(stbir__contributors);
    info->horizontal_coefficients_size = stbir__get_total_horizontal_coefficients(info) * sizeof(float);
    info->vertical_contributors_size = info->vertical_num_contributors * sizeof(stbir__contributors);
    info->vertical_coefficients_size = stbir__get_total_vertical_coefficients(info) * sizeof(float);
    info->decode_buffer_size = (info->input_w + pixel_margin * 2) * info->channels * sizeof(float);
    info->horizontal_buffer_size = info->output_w * info->channels * sizeof(float);
    info->ring_buffer_size = info->output_w * info->channels * info->ring_buffer_num_entries * sizeof(float);
    info->encode_buffer_size = info->output_w * info->channels * sizeof(float);

    STBIR_ASSERT(info->horizontal_filter != 0);
    STBIR_ASSERT(info->horizontal_filter < STBIR__ARRAY_SIZE(stbir__filter_info_table)); // this now happens too late
    STBIR_ASSERT(info->vertical_filter != 0);
    STBIR_ASSERT(info->vertical_filter < STBIR__ARRAY_SIZE(stbir__filter_info_table)); // this now happens too late

    if (stbir__use_height_upsampling(info))
        // The horizontal buffer is for when we're downsampling the height and we
        // can't output the result of sampling the decode buffer directly into the
        // ring buffers.
        info->horizontal_buffer_size = 0;
    else
        // The encode buffer is to retain precision in the height upsampling method
        // and isn't used when height downsampling.
        info->encode_buffer_size = 0;

    return info->horizontal_contributors_size + info->horizontal_coefficients_size
        + info->vertical_contributors_size + info->vertical_coefficients_size
        + info->decode_buffer_size + info->horizontal_buffer_size
        + info->ring_buffer_size + info->encode_buffer_size;
}